

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

void __thiscall
Js::SourceTextModuleRecord::SetParent
          (SourceTextModuleRecord *this,SourceTextModuleRecord *parentRecord,LPCOLESTR moduleName)

{
  Type *addr;
  Recycler *this_00;
  WriteBarrierPtr<Js::SourceTextModuleRecord> *pWVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *alloc;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 local_68 [8];
  TrackAllocData data;
  LPCOLESTR moduleName_local;
  SourceTextModuleRecord *parentRecord_local;
  
  data._32_8_ = moduleName;
  moduleName_local = (LPCOLESTR)parentRecord;
  if (parentRecord == (SourceTextModuleRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x2ec,"(parentRecord != nullptr)","parentRecord != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  EnsureChildModuleSet((SourceTextModuleRecord *)moduleName_local,(this->scriptContext).ptr);
  bVar4 = JsUtil::
          BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(*(BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          **)(moduleName_local + 0x48),(char16_t **)&data.line);
  if (bVar4) {
    return;
  }
  local_68 = (undefined1  [8])this;
  JsUtil::
  BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
            (*(BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
               **)(moduleName_local + 0x48),(char16_t **)&data.line,
             (SourceTextModuleRecord **)local_68);
  addr = &this->parentModuleList;
  if ((this->parentModuleList).ptr ==
      (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = ((this->scriptContext).ptr)->recycler;
    local_68 = (undefined1  [8])
               &JsUtil::
                List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_59ecae4;
    data.filename._0_4_ = 0x2f5;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_68);
    pLVar6 = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
    (pLVar6->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    buffer.ptr = (WriteBarrierPtr<Js::SourceTextModuleRecord> *)0x0;
    (pLVar6->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    count = 0;
    (pLVar6->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    alloc = this_00;
    (pLVar6->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_015012d0;
    pLVar6->length = 0;
    pLVar6->increment = 4;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->parentModuleList).ptr = pLVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pLVar6 = addr->ptr;
  uVar7 = (ulong)(pLVar6->
                 super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                 ).count;
  bVar4 = 0 < (long)uVar7;
  if (0 < (long)uVar7) {
    pWVar1 = (pLVar6->
             super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr;
    if ((SourceTextModuleRecord *)moduleName_local == pWVar1->ptr) goto LAB_00b140d3;
    uVar3 = 1;
    do {
      uVar8 = uVar3;
      if (uVar7 == uVar8) break;
      uVar3 = uVar8 + 1;
    } while ((SourceTextModuleRecord *)moduleName_local != pWVar1[uVar8].ptr);
    bVar4 = uVar8 < uVar7;
  }
  if (!bVar4) {
    JsUtil::
    List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(pLVar6,(SourceTextModuleRecord **)&moduleName_local);
  }
LAB_00b140d3:
  if (this->evaluating == true) {
    *(int *)(moduleName_local + 0x7e) = *(int *)(moduleName_local + 0x7e) + 1;
  }
  return;
}

Assistant:

void SourceTextModuleRecord::SetParent(SourceTextModuleRecord* parentRecord, LPCOLESTR moduleName)
    {
        Assert(parentRecord != nullptr);
        parentRecord->EnsureChildModuleSet(GetScriptContext());
        if (!parentRecord->childrenModuleSet->ContainsKey(moduleName))
        {
            parentRecord->childrenModuleSet->AddNew(moduleName, this);

            if (this->parentModuleList == nullptr)
            {
                Recycler* recycler = GetScriptContext()->GetRecycler();
                this->parentModuleList = RecyclerNew(recycler, ModuleRecordList, recycler);
            }

            if (!this->parentModuleList->Contains(parentRecord))
            {
                this->parentModuleList->Add(parentRecord);
            }

            if (IsEvaluating())
            {
                parentRecord->IncrementAwaited();
            }
        }
    }